

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall cmScriptGenerator::~cmScriptGenerator(cmScriptGenerator *this)

{
  cmScriptGenerator *this_local;
  
  ~cmScriptGenerator(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

cmScriptGenerator::~cmScriptGenerator() = default;